

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

Maybe<capnp::compiler::Compiler::CompiledType> * __thiscall
capnp::compiler::Compiler::ModuleScope::evalType
          (Maybe<capnp::compiler::Compiler::CompiledType> *__return_storage_ptr__,ModuleScope *this,
          Reader expression,ErrorReporter *errorReporter)

{
  Node *resolver;
  Compiler *compiler;
  Reader RVar1;
  ImplicitParams implicitMethodParams;
  undefined8 params;
  BrandScope *this_00;
  NullableValue<capnp::compiler::BrandedDecl> *other;
  BrandedDecl *pBVar2;
  ExternalMutexGuarded<capnp::compiler::BrandedDecl> *other_00;
  ExternalMutexGuarded<capnp::compiler::BrandedDecl> local_460;
  CompiledType local_3b0;
  BrandedDecl *local_2f8;
  BrandedDecl *result;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  SegmentReader *local_2b8;
  CapTableReader *pCStack_2b0;
  void *local_2a8;
  WirePointer *pWStack_2a0;
  undefined8 local_298;
  int iStack_290;
  undefined4 uStack_28c;
  Maybe<capnp::compiler::BrandedDecl> local_280;
  undefined1 local_1d0 [8];
  NullableValue<capnp::compiler::BrandedDecl> _result1457;
  uint64_t local_118;
  undefined1 local_110 [8];
  Own<capnp::compiler::BrandScope,_std::nullptr_t> brandScope;
  undefined1 local_e8 [8];
  Locked<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> lock;
  undefined1 local_d0 [6];
  bool found;
  ExternalMutexGuarded<capnp::compiler::BrandedDecl> newDecl;
  ErrorReporter *errorReporter_local;
  ModuleScope *this_local;
  
  RVar1._reader = expression._reader;
  newDecl.value.source._reader._40_8_ = errorReporter;
  kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::ExternalMutexGuarded
            ((ExternalMutexGuarded<capnp::compiler::BrandedDecl> *)local_d0);
  lock.ptr._6_1_ = 0;
  kj::MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_>::lockExclusive
            ((MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *)local_e8,
             &this->compiler->impl);
  params = newDecl.value.source._reader._40_8_;
  local_118 = Node::getId(this->node);
  _result1457.field_1._164_4_ = 0;
  kj::
  refcounted<capnp::compiler::BrandScope,capnp::compiler::ErrorReporter&,unsigned_long,int,capnp::compiler::Compiler::Node&>
            ((kj *)local_110,(ErrorReporter *)params,&local_118,
             (int *)((long)&_result1457.field_1 + 0xa4),this->node);
  this_00 = kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::operator->
                      ((Own<capnp::compiler::BrandScope,_std::nullptr_t> *)local_110);
  local_2b8 = expression._reader.segment;
  pCStack_2b0 = expression._reader.capTable;
  local_2a8 = expression._reader.data;
  pWStack_2a0 = expression._reader.pointers;
  local_298._0_4_ = expression._reader.dataSize;
  local_298._4_2_ = expression._reader.pointerCount;
  local_298._6_2_ = expression._reader._38_2_;
  expression._reader._40_8_ = RVar1._reader._40_8_;
  iStack_290 = expression._reader.nestingLimit;
  uStack_28c = expression._reader._44_4_;
  resolver = this->node;
  ImplicitParams::none();
  RVar1._reader.capTable = pCStack_2b0;
  RVar1._reader.segment = local_2b8;
  RVar1._reader.data = local_2a8;
  RVar1._reader.pointers = pWStack_2a0;
  RVar1._reader.dataSize = (StructDataBitCount)local_298;
  RVar1._reader.pointerCount = local_298._4_2_;
  RVar1._reader._38_2_ = local_298._6_2_;
  RVar1._reader.nestingLimit = iStack_290;
  RVar1._reader._44_4_ = uStack_28c;
  implicitMethodParams.params.reader.segment = (SegmentReader *)uStack_2e8;
  implicitMethodParams.scopeId = (uint64_t)result;
  implicitMethodParams.params.reader.capTable = (CapTableReader *)local_2e0;
  implicitMethodParams.params.reader.ptr = (byte *)uStack_2d8;
  implicitMethodParams.params.reader.elementCount = (undefined4)local_2d0;
  implicitMethodParams.params.reader.step = local_2d0._4_4_;
  implicitMethodParams.params.reader.structDataSize = (undefined4)uStack_2c8;
  implicitMethodParams.params.reader.structPointerCount = uStack_2c8._4_2_;
  implicitMethodParams.params.reader.elementSize = uStack_2c8._6_1_;
  implicitMethodParams.params.reader._39_1_ = uStack_2c8._7_1_;
  implicitMethodParams.params.reader._40_8_ = local_2c0;
  BrandScope::compileDeclExpression
            (&local_280,this_00,RVar1,&resolver->super_Resolver,implicitMethodParams);
  other = kj::_::readMaybe<capnp::compiler::BrandedDecl>(&local_280);
  kj::_::NullableValue<capnp::compiler::BrandedDecl>::NullableValue
            ((NullableValue<capnp::compiler::BrandedDecl> *)local_1d0,other);
  kj::Maybe<capnp::compiler::BrandedDecl>::~Maybe(&local_280);
  pBVar2 = kj::_::NullableValue::operator_cast_to_BrandedDecl_((NullableValue *)local_1d0);
  if (pBVar2 != (BrandedDecl *)0x0) {
    local_2f8 = kj::_::NullableValue<capnp::compiler::BrandedDecl>::operator*
                          ((NullableValue<capnp::compiler::BrandedDecl> *)local_1d0);
    pBVar2 = kj::mv<capnp::compiler::BrandedDecl>(local_2f8);
    kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::
    set<kj::Own<capnp::compiler::Compiler::Impl,decltype(nullptr)>>
              ((ExternalMutexGuarded<capnp::compiler::BrandedDecl> *)local_d0,
               (Locked<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *)local_e8,pBVar2)
    ;
    lock.ptr._6_1_ = 1;
  }
  kj::_::NullableValue<capnp::compiler::BrandedDecl>::~NullableValue
            ((NullableValue<capnp::compiler::BrandedDecl> *)local_1d0);
  kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::~Own
            ((Own<capnp::compiler::BrandScope,_std::nullptr_t> *)local_110);
  kj::Locked<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_>::~Locked
            ((Locked<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *)local_e8);
  if ((lock.ptr._6_1_ & 1) == 0) {
    kj::Maybe<capnp::compiler::Compiler::CompiledType>::Maybe(__return_storage_ptr__);
  }
  else {
    compiler = this->compiler;
    other_00 = kj::mv<kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>>
                         ((ExternalMutexGuarded<capnp::compiler::BrandedDecl> *)local_d0);
    kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::ExternalMutexGuarded
              (&local_460,other_00);
    CompiledType::CompiledType(&local_3b0,compiler,&local_460);
    kj::Maybe<capnp::compiler::Compiler::CompiledType>::Maybe(__return_storage_ptr__,&local_3b0);
    CompiledType::~CompiledType(&local_3b0);
    kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::~ExternalMutexGuarded(&local_460);
  }
  kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::~ExternalMutexGuarded
            ((ExternalMutexGuarded<capnp::compiler::BrandedDecl> *)local_d0);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<Compiler::CompiledType> Compiler::ModuleScope::evalType(
    Expression::Reader expression, ErrorReporter& errorReporter) {
  kj::ExternalMutexGuarded<BrandedDecl> newDecl;
  bool found = false;

  {
    auto lock = compiler.impl.lockExclusive();
    auto brandScope = kj::refcounted<BrandScope>(errorReporter, node.getId(), 0, node);
    KJ_IF_SOME(result, brandScope->compileDeclExpression(
        expression, node, ImplicitParams::none())) {
      newDecl.set(lock, kj::mv(result));
      found = true;
    };
  }

  if (found) {
    return CompiledType(compiler, kj::mv(newDecl));
  } else {
    return kj::none;
  }
}